

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void sdf_tools::exportGrid(module *m)

{
  class_<sdf_tools::Grid> *pcVar1;
  class_<sdf_tools::Grid> *this;
  type *f;
  char (*extra_3) [235];
  arg aVar2;
  arg aVar3;
  arg aVar4;
  arg aVar5;
  char (*in_stack_fffffffffffffdb8) [242];
  arg *in_stack_fffffffffffffdc0;
  arg *in_stack_fffffffffffffdc8;
  arg *in_stack_fffffffffffffdd0;
  constructor<sdf_tools::int3,_sdf_tools::real3,_sdf_tools::real3> *in_stack_fffffffffffffdd8;
  class_<sdf_tools::Grid> *in_stack_fffffffffffffde0;
  char (*in_stack_fffffffffffffe20) [177];
  char (*in_stack_fffffffffffffe38) [47];
  char *in_stack_fffffffffffffe40;
  class_<sdf_tools::Grid> *in_stack_fffffffffffffe48;
  handle in_stack_fffffffffffffe50;
  
  pybind11::class_<sdf_tools::Grid>::class_<char[47]>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  pybind11::init<sdf_tools::int3,sdf_tools::real3,sdf_tools::real3>();
  aVar2 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  aVar3 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  aVar4 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  pcVar1 = pybind11::class_<sdf_tools::Grid>::
           def<sdf_tools::int3,sdf_tools::real3,sdf_tools::real3,pybind11::arg,pybind11::arg,pybind11::arg,char[242]>
                     (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                      in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8)
  ;
  this = pybind11::class_<sdf_tools::Grid>::
         def<std::vector<float,std::allocator<float>>&(sdf_tools::Grid::*)(),char[71]>
                   (aVar3._8_8_,aVar4.name,aVar4._8_8_,(char (*) [71])pcVar1);
  pcVar1 = pybind11::class_<sdf_tools::Grid>::
           def<std::vector<float,std::allocator<float>>const&(sdf_tools::Grid::*)()const,char[79]>
                     (aVar3._8_8_,aVar4.name,aVar4._8_8_,(char (*) [79])pcVar1);
  aVar5 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  f = (type *)pybind11::class_<sdf_tools::Grid>::
              def<sdf_tools::exportGrid(pybind11::module_&)::__0,pybind11::arg,char[177]>
                        (this,(char *)pcVar1,(type *)aVar5.name,aVar5._8_8_,
                         in_stack_fffffffffffffe20);
  pybind11::class_<sdf_tools::Grid>::def<sdf_tools::exportGrid(pybind11::module_&)::__1>
            ((class_<sdf_tools::Grid> *)aVar5.name,aVar5._8_8_,f);
  pybind11::class_<sdf_tools::Grid>::def<sdf_tools::exportGrid(pybind11::module_&)::__2>
            ((class_<sdf_tools::Grid> *)aVar5.name,aVar5._8_8_,(type *)f);
  pybind11::literals::operator____a
            ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  pybind11::class_<sdf_tools::Grid>::
  def<void(sdf_tools::Grid::*)(std::__cxx11::string_const&),pybind11::arg,char[291]>
            (aVar2._8_8_,aVar3.name,aVar3._8_8_,(arg *)aVar4.name,aVar4._8_8_);
  pybind11::literals::operator____a
            ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  aVar4 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  extra_3 = (char (*) [235])aVar4.name;
  aVar4 = pybind11::literals::operator____a
                    ((char *)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  pybind11::class_<sdf_tools::Grid>::
  def<void(sdf_tools::Grid::*)(float,float,int),pybind11::arg,pybind11::arg,pybind11::arg,char[235]>
            ((class_<sdf_tools::Grid> *)aVar4.name,aVar4._8_8_,(offset_in_Grid_to_subr *)aVar4.name,
             (arg *)aVar2.name,aVar2._8_8_,(arg *)aVar3.name,extra_3);
  pybind11::class_<sdf_tools::Grid>::~class_((class_<sdf_tools::Grid> *)0x16057a);
  return;
}

Assistant:

void exportGrid(py::module& m)
{
    py::class_<Grid> (m, "Uniform", R"(
        container to hold SDF grid data

    )")
        .def(py::init <int3, real3, real3> (),
             "dimensions"_a, "offsets"_a, "extents"_a, R"(
            Create an empty uniform grid of given size.

            Args:
                dimensions: Number of cells along each dimension.
                offsets: Start of the domain.
                extents: Size of the domain.
        )")

        .def("get", (std::vector<real>& (Grid::*)()) &Grid::getData, R"(
            Returns a list of all values in a flatten array.
        )")
        .def("get", (const std::vector<real>& (Grid::*)() const) &Grid::getData, R"(
            Returns a list of all values in a flatten array (const).
        )")

        .def("dump", [](const Grid *g, std::string name) {io::dumpGrid(std::move(name), g);},
          "name"_a, R"(
          Dump the data to a file.
          Supported format: .bov, .vtk, .sdf

          Args:
              name: Filename (with the desired extension) to dump to.
        )")

        .def("evaluate_sdf", [](Grid *grid, const sdf::Sdf *sdf) {evaluateAtGridPoints(sdf, grid);})
        .def("evaluate_sdf_periodic", [](Grid *grid, const sdf::Sdf *sdf) {evaluateAtGridPointsPeriodic(sdf, grid);})

        .def("flip", &Grid::flip,
             "map"_a, R"(
          Flip axes of the grid according to map.

          Args:
              map: The flip map description.

          examples:
              * map = 'xyz' does not flip anything
              * map = 'yxz' flip x and y axes
              * map = 'zxy' z -> x, y -> z, x -> y
        )")
        .def("extrude", &Grid::extrude,
             "zoffset"_a, "zextent"_a, "nz"_a, R"(
          Extrude a SDF from 'xy' plane to 3 dimensions.

          Args:
              zoffset: Offset in the new direction.
              zextent: Extent in the new direction.
              nz: Resolution in new direction.
        )");
}